

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateComputeI32InputAtDefinition
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst)

{
  Instruction *inst_00;
  Instruction *decoration_00;
  bool bVar1;
  int iVar2;
  spv_result_t sVar3;
  spv_const_context psVar4;
  DiagnosticStream *pDVar5;
  AssemblyGrammar *this_00;
  anon_class_24_3_41b08022 local_250;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_238;
  undefined4 local_214;
  char *pcStack_210;
  spv_result_t error;
  DiagnosticStream local_208;
  BuiltIn local_2c;
  Instruction *pIStack_28;
  BuiltIn builtin;
  Instruction *inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  pIStack_28 = inst;
  inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  psVar4 = ValidationState_t::context(this->_);
  bVar1 = spvIsVulkanEnv(psVar4->target_env);
  if (bVar1) {
    local_2c = Decoration::builtin((Decoration *)inst_local);
    iVar2 = Decoration::struct_member_index((Decoration *)inst_local);
    decoration_00 = inst_local;
    inst_00 = pIStack_28;
    if (iVar2 != -1) {
      ValidationState_t::diag(&local_208,this->_,SPV_ERROR_INVALID_DATA,pIStack_28);
      pDVar5 = DiagnosticStream::operator<<(&local_208,(char (*) [9])0xf2cb2b);
      this_00 = ValidationState_t::grammar(this->_);
      pcStack_210 = AssemblyGrammar::lookupOperandName(this_00,SPV_OPERAND_TYPE_BUILT_IN,local_2c);
      pDVar5 = DiagnosticStream::operator<<(pDVar5,&stack0xfffffffffffffdf0);
      pDVar5 = DiagnosticStream::operator<<
                         (pDVar5,(char (*) [40])" cannot be used as a member decoration ");
      this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
      DiagnosticStream::~DiagnosticStream(&local_208);
      return this_local._4_4_;
    }
    local_250.inst = pIStack_28;
    local_250.builtin = local_2c;
    local_250.this = this;
    std::function<spv_result_t(std::__cxx11::string_const&)>::
    function<spvtools::val::(anonymous_namespace)::BuiltInsValidator::ValidateComputeI32InputAtDefinition(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&)::__0,void>
              ((function<spv_result_t(std::__cxx11::string_const&)> *)&local_238,&local_250);
    sVar3 = ValidateI32(this,(Decoration *)decoration_00,inst_00,&local_238);
    std::
    function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_238);
    if (sVar3 != SPV_SUCCESS) {
      return sVar3;
    }
    local_214 = 0;
  }
  sVar3 = ValidateComputeI32InputAtReference
                    (this,(Decoration *)inst_local,pIStack_28,pIStack_28,pIStack_28);
  return sVar3;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateComputeI32InputAtDefinition(
    const Decoration& decoration, const Instruction& inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::BuiltIn builtin = decoration.builtin();
    if (decoration.struct_member_index() != Decoration::kInvalidMember) {
      return _.diag(SPV_ERROR_INVALID_DATA, &inst)
             << "BuiltIn "
             << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN, uint32_t(builtin))
             << " cannot be used as a member decoration ";
    }
    if (spv_result_t error = ValidateI32(
            decoration, inst,
            [this, &inst, builtin](const std::string& message) -> spv_result_t {
              uint32_t vuid = GetVUIDForBuiltin(builtin, VUIDErrorType);
              return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                     << _.VkErrorID(vuid)
                     << "According to the "
                     << spvLogStringForEnv(_.context()->target_env)
                     << " spec BuiltIn "
                     << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN, uint32_t(builtin))
                     << " variable needs to be a 32-bit int "
                        "vector. "
                     << message;
            })) {
      return error;
    }
  }

  // Seed at reference checks with this built-in.
  return ValidateComputeI32InputAtReference(decoration, inst, inst, inst);
}